

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::CompactReporter::sectionEnded(CompactReporter *this,SectionStats *_sectionStats)

{
  double duration;
  bool bVar1;
  ostream *poVar2;
  SectionStats *this_00;
  string local_38;
  
  duration = _sectionStats->durationInSeconds;
  this_00 = _sectionStats;
  bVar1 = shouldShowDuration((this->super_StreamingReporterBase).m_config,duration);
  if (bVar1) {
    poVar2 = (this->super_StreamingReporterBase).stream;
    getFormattedDuration_abi_cxx11_(&local_38,(Catch *)this_00,duration);
    poVar2 = std::operator<<(poVar2,(string *)&local_38);
    poVar2 = std::operator<<(poVar2," s: ");
    poVar2 = std::operator<<(poVar2,(string *)_sectionStats);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return;
}

Assistant:

void CompactReporter::sectionEnded(SectionStats const &_sectionStats) {
        double dur = _sectionStats.durationInSeconds;
        if (shouldShowDuration(*m_config, dur)) {
            stream << getFormattedDuration(dur) << " s: " << _sectionStats.sectionInfo.name << std::endl;
        }
    }